

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O1

void __thiscall
ylt::metric::dynamic_metric_manager<test_id_t<31UL>_>::clean_label_expired
          (dynamic_metric_manager<test_id_t<31UL>_> *this)

{
  atomic<unsigned_long> *paVar1;
  _Atomic_word *p_Var2;
  ulong uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __atomic_base<long> this_00;
  element_type *peVar5;
  undefined8 uVar6;
  int iVar7;
  pointer local_48;
  _Alloc_hider local_40;
  element_type *in_stack_ffffffffffffffc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  coro_io::create_io_context_pool<coro_io::io_context_pool>
            ((uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  uVar6 = aStack_30._M_allocated_capacity;
  aStack_30._M_allocated_capacity = 0;
  p_Var4 = (this->executor_).
           super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->executor_).super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_stack_ffffffffffffffc8;
  (this->executor_).super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_30._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_30._M_allocated_capacity);
  }
  this_00._M_i = (__int_type)
                 (this->executor_).
                 super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_i !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(this_00._M_i + 8) = *(_Atomic_word *)(this_00._M_i + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(this_00._M_i + 8) = *(_Atomic_word *)(this_00._M_i + 8) + 1;
    }
  }
  peVar5 = (this->executor_).
           super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  LOCK();
  paVar1 = &peVar5->next_io_context_;
  uVar3 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_40._M_p =
       *(pointer *)
        &(peVar5->executors).
         super__Vector_base<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start
         [uVar3 % (ulong)((long)(peVar5->io_contexts_).
                                super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(peVar5->io_contexts_).
                                super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4)]._M_t;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<coro_io::period_timer,std::allocator<coro_io::period_timer>,coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_30._M_allocated_capacity,
             (period_timer **)&stack0xffffffffffffffc8,(allocator<coro_io::period_timer> *)&local_48
             ,(ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> **
              )&local_40);
  uVar6 = aStack_30._M_allocated_capacity;
  aStack_30._M_allocated_capacity = 0;
  p_Var4 = (this->timer_).super___shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->timer_).super___shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->timer_).super___shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_30._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_30._M_allocated_capacity);
  }
  aStack_30._8_8_ =
       (this->timer_).super___shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20._M_pi =
       (this->timer_).super___shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_weak_count = (local_20._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_weak_count = (local_20._M_pi)->_M_weak_count + 1;
    }
  }
  check_label_expired((dynamic_metric_manager<test_id_t<31UL>_> *)&local_48,
                      (weak_ptr<coro_io::period_timer> *)this);
  LOCK();
  paVar1 = &((this->executor_).
             super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            next_io_context_;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  async_simple::coro::Lazy<void>::via((Lazy<void> *)&local_40,(Executor *)&local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_i !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(this_00._M_i + 8) = *(_Atomic_word *)(this_00._M_i + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(this_00._M_i + 8) = *(_Atomic_word *)(this_00._M_i + 8) + 1;
    }
  }
  aStack_30._M_allocated_capacity = this_00._M_i;
  async_simple::coro::detail::LazyBase<void,_true>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_metric_metric_manager_hpp:467:16)>
            ((LazyBase<void,_true> *)&local_40,(type *)&stack0xffffffffffffffc8);
  if (aStack_30._M_allocated_capacity != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_30._M_allocated_capacity);
  }
  if ((ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)
      local_40._M_p !=
      (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)0x0) {
    (*(code *)(((string *)(local_40._M_p + 8))->_M_dataplus)._M_p)();
    local_40._M_p = (pointer)0x0;
  }
  if (local_48 != (pointer)0x0) {
    (*(code *)(local_48->map_)._M_t.
              super___uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>_*,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>_>_>
              .
              super__Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>_*,_false>
              ._M_head_impl)();
    local_48 = (pointer)0x0;
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &(local_20._M_pi)->_M_weak_count;
      iVar7 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar7 = (local_20._M_pi)->_M_weak_count;
      (local_20._M_pi)->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*(local_20._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_i !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_i);
  }
  return;
}

Assistant:

void clean_label_expired() {
    executor_ = coro_io::create_io_context_pool(1);
    auto sp = executor_;
    timer_ = std::make_shared<coro_io::period_timer>(executor_->get_executor());
    check_label_expired(timer_)
        .via(executor_->get_executor())
        .start([sp](auto&&) {
        });
  }